

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  longdouble *plVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  _Var5;
  bool bVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  _Head_base<0UL,_int_*,_false> _Var12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  tVar16;
  row_iterator prVar17;
  long lVar18;
  long lVar19;
  longdouble lVar20;
  undefined1 local_b8 [20];
  longdouble local_a4;
  longdouble local_98;
  int local_8c;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_88;
  long local_80;
  undefined1 local_78 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_68;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_58;
  ulong local_50;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_48;
  longdouble local_3c;
  
  local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
  local_3c = theta;
  local_98 = delta;
  local_a4 = kappa / ((longdouble)1 - kappa);
  _Var7._M_current = (first->current)._M_current;
  local_60 = first;
  local_58._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )last;
  do {
    if (_Var7._M_current ==
        *(int **)local_58._M_t.
                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                 .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                 _M_head_impl) {
      return false;
    }
    tVar16.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(long)_Var7._M_current[-1];
    if (*(int *)(this + 0x80) <= _Var7._M_current[-1]) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar14 = (int)local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_b8,iVar14);
    solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                *)this,(row_iterator)local_b8._8_8_,(row_iterator)local_b8._0_8_,local_3c);
    uVar15 = 0;
    for (_Var12._M_head_impl = (int *)local_b8._8_8_; _Var12._M_head_impl != (int *)local_b8._0_8_;
        _Var12._M_head_impl = _Var12._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)local_78,iVar14);
      lVar18 = *(long *)(this + 0x48);
      lVar20 = (longdouble)0;
      for (; local_78._8_8_ != local_78._0_8_; local_78._8_8_ = local_78._8_8_ + 8) {
        local_8c = *(int *)(lVar18 + (long)*(int *)local_78._8_8_ * 4);
        lVar20 = *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)local_78._8_8_ * 0x10) *
                 (longdouble)local_8c + lVar20;
      }
      lVar8 = *(long *)(this + 0x50);
      lVar11 = uVar15 * 0x20;
      *(int *)(lVar8 + 0x10 + lVar11) = (int)uVar15;
      uVar15 = uVar15 + 1;
      *(undefined4 *)(lVar8 + 0x14 + lVar11) =
           *(undefined4 *)(lVar18 + (long)*_Var12._M_head_impl * 4);
      *(longdouble *)(lVar8 + lVar11) =
           *(longdouble *)
            (*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_b8._8_8_ + 4) * 0x10) -
           lVar20;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>
              (*(rc_data **)(this + 0x50),*(rc_data **)(this + 0x50) + (uVar15 & 0xffffffff),
               *(random_engine **)this);
    lVar18 = *(long *)(this + 0x58);
    local_80 = (long)tVar16.
                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                     .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                     _M_head_impl * 0xc;
    local_88._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )tVar16.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
    local_50 = uVar15;
    if (*(int *)(lVar18 + local_80) < 1) {
      iVar14 = 0;
      uVar15 = 0xffffffffffffffff;
LAB_0019e179:
      bVar6 = iVar14 <= *(int *)(lVar18 + 4 + local_80);
    }
    else {
      lVar19 = -0x100000000;
      lVar11 = 0;
      local_48._M_head_impl = (col_value *)(long)((int)uVar15 + -2);
      lVar18 = *(long *)(this + 0x50);
      iVar14 = 0;
      lVar8 = -1;
      do {
        uVar4 = local_b8._8_8_;
        iVar14 = iVar14 + *(int *)(lVar18 + 0x14 + lVar11);
        lVar19 = lVar19 + 0x100000000;
        iVar2 = *(int *)(lVar18 + 0x10 + lVar11);
        iVar3 = *(int *)(*(long *)(this + 0x58) + local_80);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_b8._8_8_ + (long)iVar2 * 8))->column);
        lVar18 = *(long *)(this + 0x50);
        lVar9 = (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar9) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar9) +
             local_98 + local_a4 * *(longdouble *)(lVar18 + lVar11) * (longdouble)0.5;
        if (iVar3 <= iVar14) break;
        lVar11 = lVar11 + 0x20;
        bVar6 = lVar8 < (long)local_48._M_head_impl;
        lVar8 = lVar8 + 1;
      } while (bVar6);
      lVar18 = *(long *)(this + 0x58);
      uVar15 = lVar19 >> 0x20;
      if (*(int *)(lVar18 + local_80) <= iVar14) goto LAB_0019e179;
      bVar6 = false;
    }
    uVar10 = (ulong)(int)(size_type)local_50;
    lVar18 = uVar15 << 5;
    uVar13 = uVar15;
    while( true ) {
      _Var5._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              )local_88;
      uVar13 = uVar13 + 1;
      uVar15 = uVar15 + 1;
      if ((uVar10 <= uVar15) || (!bVar6)) break;
      lVar8 = *(long *)(this + 0x50);
      iVar14 = iVar14 + *(int *)(lVar8 + 0x34 + lVar18);
      if (iVar14 < *(int *)(*(long *)(this + 0x58) + local_80)) {
        prVar17 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar8 + 0x30 + lVar18) * 8);
LAB_0019e240:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar17->column);
        lVar8 = (long)prVar17->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar8) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar8) -
             (local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar18) * (longdouble)0.5);
        bVar6 = false;
      }
      else {
        prVar17 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar8 + 0x30 + lVar18) * 8);
        if ((*(int *)(*(long *)(this + 0x58) + local_80 + 4) < iVar14) ||
           (bVar6 = stop_iterating<baryonyx::itm::minimize_tag,long_double>
                              (*(longdouble *)(lVar8 + 0x20 + lVar18),*(random_engine **)this),
           !bVar6)) goto LAB_0019e240;
        bit_array_impl::set(&x->super_bit_array_impl,prVar17->column);
        lVar8 = (long)prVar17->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar8) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar8) +
             local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar18) * (longdouble)0.5;
        bVar6 = true;
      }
      lVar18 = lVar18 + 0x20;
    }
    for (; uVar4 = local_b8._8_8_, uVar13 < uVar10; uVar13 = uVar13 + 1) {
      iVar14 = *(int *)(*(long *)(this + 0x50) + 0x30 + lVar18);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_b8._8_8_ + (long)iVar14 * 8))->column);
      plVar1 = (longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar18);
      lVar18 = lVar18 + 0x20;
      lVar8 = (long)((row_iterator)(uVar4 + (long)iVar14 * 8))->value * 0x10;
      *(longdouble *)(*(long *)(this + 0x68) + lVar8) =
           *(longdouble *)(*(long *)(this + 0x68) + lVar8) -
           (local_98 + local_a4 * *plVar1 * (longdouble)0.5);
    }
    bVar6 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                        *)this,(int)_Var5._M_t.
                                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                                    .
                                    super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>
                                    ._M_head_impl,x);
    if (!bVar6) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    _Var7._M_current = (local_60->current)._M_current + -1;
    (local_60->current)._M_current = _Var7._M_current;
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }